

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMerge.c
# Opt level: O1

void Abc_NtkCollectOverlapCands(Abc_Obj_t *pLut,Vec_Ptr_t *vCands,Nwk_LMPars_t *pPars)

{
  uint *puVar1;
  Abc_Ntk_t *pAVar2;
  long *plVar3;
  Abc_Obj_t *pCand;
  Abc_Ntk_t *pAVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  void **ppvVar9;
  uint uVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar11;
  Nwk_LMPars_t *pNVar12;
  ulong extraout_RDX;
  ulong uVar13;
  ulong extraout_RDX_00;
  ulong uVar14;
  int iVar15;
  
  pNVar12 = pPars;
  if (0 < (pLut->vFanins).nSize) {
    lVar7 = 0;
    do {
      pNVar12 = (Nwk_LMPars_t *)(long)(pLut->vFanins).pArray[lVar7];
      puVar1 = (uint *)((long)pLut->pNtk->vObjs->pArray[(long)pNVar12] + 0x14);
      *puVar1 = *puVar1 | 0x40;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (pLut->vFanins).nSize);
  }
  iVar6 = (int)pNVar12;
  vCands->nSize = 0;
  pAVar2 = pLut->pNtk;
  if ((pAVar2->vTravIds).pArray == (int *)0x0) {
    iVar11 = pAVar2->vObjs->nSize;
    uVar14 = (long)iVar11 + 500;
    iVar15 = (int)uVar14;
    if ((pAVar2->vTravIds).nCap < iVar15) {
      piVar8 = (int *)malloc(uVar14 * 4);
      (pAVar2->vTravIds).pArray = piVar8;
      if (piVar8 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar2->vTravIds).nCap = iVar15;
      iVar6 = extraout_EDX;
    }
    if (-500 < iVar11) {
      memset((pAVar2->vTravIds).pArray,0,(uVar14 & 0xffffffff) << 2);
      iVar6 = extraout_EDX_00;
    }
    (pAVar2->vTravIds).nSize = iVar15;
  }
  iVar11 = pAVar2->nTravIds;
  pAVar2->nTravIds = iVar11 + 1;
  if (0x3ffffffe < iVar11) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pAVar2 = pLut->pNtk;
  iVar11 = pAVar2->nTravIds;
  iVar15 = pLut->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar15 + 1,iVar6);
  if ((-1 < (long)iVar15) && (iVar15 < (pAVar2->vTravIds).nSize)) {
    (pAVar2->vTravIds).pArray[iVar15] = iVar11;
    if (0 < (pLut->vFanins).nSize) {
      uVar14 = 0;
      do {
        plVar3 = (long *)pLut->pNtk->vObjs->pArray[(pLut->vFanins).pArray[uVar14]];
        if ((((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7) &&
            (*(int *)((long)plVar3 + 0x2c) <= pPars->nMaxFanout)) &&
           (0 < *(int *)((long)plVar3 + 0x2c))) {
          lVar7 = 0;
          uVar13 = uVar14;
          do {
            pCand = *(Abc_Obj_t **)
                     (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                     (long)*(int *)(plVar3[6] + lVar7 * 4) * 8);
            if ((*(uint *)&pCand->field_0x14 & 0xf) == 7) {
              pAVar2 = pCand->pNtk;
              iVar6 = pCand->Id;
              Vec_IntFillExtra(&pAVar2->vTravIds,iVar6 + 1,(int)uVar13);
              if (((long)iVar6 < 0) || ((pAVar2->vTravIds).nSize <= iVar6)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              pAVar4 = pCand->pNtk;
              iVar11 = pAVar4->nTravIds;
              uVar13 = extraout_RDX;
              if ((pAVar2->vTravIds).pArray[iVar6] != iVar11) {
                iVar6 = pCand->Id;
                Vec_IntFillExtra(&pAVar4->vTravIds,iVar6 + 1,(int)extraout_RDX);
                if (((long)iVar6 < 0) || ((pAVar4->vTravIds).nSize <= iVar6)) goto LAB_002dc9e3;
                (pAVar4->vTravIds).pArray[iVar6] = iVar11;
                uVar5 = *(uint *)&pLut->field_0x14 >> 0xc;
                uVar10 = *(uint *)&pCand->field_0x14 >> 0xc;
                iVar11 = uVar5 - uVar10;
                iVar6 = pPars->nMaxLevelDiff;
                uVar13 = (ulong)CONCAT31((int3)((uint)iVar11 >> 8),iVar6 < iVar11);
                if ((int)(uVar10 - uVar5) <= iVar6 && iVar6 >= iVar11) {
                  iVar6 = Abc_NtkCountTotalFanins(pLut,pCand);
                  uVar13 = extraout_RDX_00;
                  if (iVar6 <= pPars->nMaxSuppSize) {
                    uVar5 = vCands->nCap;
                    if (vCands->nSize == uVar5) {
                      if ((int)uVar5 < 0x10) {
                        if (vCands->pArray == (void **)0x0) {
                          ppvVar9 = (void **)malloc(0x80);
                        }
                        else {
                          ppvVar9 = (void **)realloc(vCands->pArray,0x80);
                        }
                        vCands->pArray = ppvVar9;
                        iVar6 = 0x10;
                      }
                      else {
                        iVar6 = uVar5 * 2;
                        if (iVar6 <= (int)uVar5) goto LAB_002dc944;
                        if (vCands->pArray == (void **)0x0) {
                          ppvVar9 = (void **)malloc((ulong)uVar5 << 4);
                        }
                        else {
                          ppvVar9 = (void **)realloc(vCands->pArray,(ulong)uVar5 << 4);
                        }
                        vCands->pArray = ppvVar9;
                      }
                      vCands->nCap = iVar6;
                    }
LAB_002dc944:
                    iVar6 = vCands->nSize;
                    uVar5 = iVar6 + 1;
                    uVar13 = (ulong)uVar5;
                    vCands->nSize = uVar5;
                    vCands->pArray[iVar6] = pCand;
                  }
                }
              }
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < *(int *)((long)plVar3 + 0x2c));
        }
        uVar14 = uVar14 + 1;
      } while ((long)uVar14 < (long)(pLut->vFanins).nSize);
    }
    if (0 < (pLut->vFanins).nSize) {
      lVar7 = 0;
      do {
        puVar1 = (uint *)((long)pLut->pNtk->vObjs->pArray[(pLut->vFanins).pArray[lVar7]] + 0x14);
        *puVar1 = *puVar1 & 0xffffffbf;
        lVar7 = lVar7 + 1;
      } while (lVar7 < (pLut->vFanins).nSize);
    }
    return;
  }
LAB_002dc9e3:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Abc_NtkCollectOverlapCands( Abc_Obj_t * pLut, Vec_Ptr_t * vCands, Nwk_LMPars_t * pPars )
{
    Abc_Obj_t * pFanin, * pObj;
    int i, k;
    // mark fanins of pLut
    Abc_ObjForEachFanin( pLut, pFanin, i )
        pFanin->fMarkC = 1;
    // collect the matching fanouts of each fanin of the node
    Vec_PtrClear( vCands );
    Abc_NtkIncrementTravId( pLut->pNtk );
    Abc_NodeSetTravIdCurrent( pLut );
    Abc_ObjForEachFanin( pLut, pFanin, i )
    {
        if ( !Abc_ObjIsNode(pFanin) )
            continue;
        if ( Abc_ObjFanoutNum(pFanin) > pPars->nMaxFanout )
            continue;
        Abc_ObjForEachFanout( pFanin, pObj, k )
        {
            if ( !Abc_ObjIsNode(pObj) )
                continue;
            if ( Abc_NodeIsTravIdCurrent( pObj ) )
                continue;
            Abc_NodeSetTravIdCurrent( pObj );
            // check the difference in delay
            if ( Abc_ObjLevel(pLut) - Abc_ObjLevel(pObj) > pPars->nMaxLevelDiff || 
                 Abc_ObjLevel(pObj) - Abc_ObjLevel(pLut) > pPars->nMaxLevelDiff )
                 continue;
            // check the total number of fanins of the node
            if ( Abc_NtkCountTotalFanins(pLut, pObj) > pPars->nMaxSuppSize )
                continue;
            Vec_PtrPush( vCands, pObj );
        }
    }
    // unmark fanins of pLut
    Abc_ObjForEachFanin( pLut, pFanin, i )
        pFanin->fMarkC = 0;
}